

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,UnicodeString *unistr,Field field,
          UErrorCode *status)

{
  char16_t cVar1;
  int32_t iVar2;
  UErrorCode *status_local;
  Field field_local;
  UnicodeString *unistr_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  iVar2 = UnicodeString::length(unistr);
  if (iVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = UnicodeString::length(unistr);
    if (iVar2 == 1) {
      cVar1 = UnicodeString::charAt(unistr,0);
      this_local._4_4_ = insertCodePoint(this,index,(uint)(ushort)cVar1,field,status);
    }
    else {
      iVar2 = UnicodeString::length(unistr);
      this_local._4_4_ = insert(this,index,unistr,0,iVar2,field,status);
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t NumberStringBuilder::insert(int32_t index, const UnicodeString &unistr, Field field,
                                    UErrorCode &status) {
    if (unistr.length() == 0) {
        // Nothing to insert.
        return 0;
    } else if (unistr.length() == 1) {
        // Fast path: insert using insertCodePoint.
        return insertCodePoint(index, unistr.charAt(0), field, status);
    } else {
        return insert(index, unistr, 0, unistr.length(), field, status);
    }
}